

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBase64Encode(char *zSrc,sxu32 nLen,ProcConsumer xConsumer,void *pUserData)

{
  int iVar1;
  uint local_40;
  sxi32 rc;
  sxu32 i;
  uchar z64 [4];
  uchar *zIn;
  void *pUserData_local;
  ProcConsumer xConsumer_local;
  sxu32 nLen_local;
  char *zSrc_local;
  
  _i = zSrc;
  for (local_40 = 0; local_40 + 2 < nLen; local_40 = local_40 + 3) {
    rc._0_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(uint)(byte)_i[local_40] >> 2];
    rc._1_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(((byte)_i[local_40] & 3) << 4 | (int)(uint)(byte)_i[local_40 + 1] >> 4)];
    rc._2_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(((byte)_i[local_40 + 1] & 0xf) << 2 | (int)(uint)(byte)_i[local_40 + 2] >> 6)]
    ;
    rc._3_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)((byte)_i[local_40 + 2] & 0x3f)];
    iVar1 = (*xConsumer)(&rc,4,pUserData);
    if (iVar1 != 0) {
      return -10;
    }
  }
  if (local_40 + 1 < nLen) {
    rc._0_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(uint)(byte)_i[local_40] >> 2];
    rc._1_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(((byte)_i[local_40] & 3) << 4 | (int)(uint)(byte)_i[local_40 + 1] >> 4)];
    rc._2_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(((byte)_i[local_40 + 1] & 0xf) << 2)];
    rc._3_1_ = 0x3d;
    iVar1 = (*xConsumer)(&rc,4,pUserData);
    if (iVar1 != 0) {
      return -10;
    }
  }
  else if (local_40 < nLen) {
    rc._0_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(uint)(byte)_i[local_40] >> 2];
    rc._1_1_ = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(((byte)_i[local_40] & 3) << 4)];
    rc._2_1_ = 0x3d;
    rc._3_1_ = 0x3d;
    iVar1 = (*xConsumer)(&rc,4,pUserData);
    if (iVar1 != 0) {
      return -10;
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBase64Encode(const char *zSrc, sxu32 nLen, ProcConsumer xConsumer, void *pUserData)
{
	static const unsigned char zBase64[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
	unsigned char *zIn = (unsigned char *)zSrc;
	unsigned char z64[4];
	sxu32 i;
	sxi32 rc;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) || xConsumer == 0){
		return SXERR_EMPTY;
	}
#endif
	for(i = 0; i + 2 < nLen; i += 3){
		z64[0] = zBase64[(zIn[i] >> 2) & 0x3F];
		z64[1] = zBase64[( ((zIn[i] & 0x03) << 4)   | (zIn[i+1] >> 4)) & 0x3F]; 
		z64[2] = zBase64[( ((zIn[i+1] & 0x0F) << 2) | (zIn[i + 2] >> 6) ) & 0x3F];
		z64[3] = zBase64[ zIn[i + 2] & 0x3F];
		
		rc = xConsumer((const void *)z64, sizeof(z64), pUserData);
		if( rc != SXRET_OK ){return SXERR_ABORT;}

	}	
	if ( i+1 < nLen ){
		z64[0] = zBase64[(zIn[i] >> 2) & 0x3F];
		z64[1] = zBase64[( ((zIn[i] & 0x03) << 4)   | (zIn[i+1] >> 4)) & 0x3F]; 
		z64[2] = zBase64[(zIn[i+1] & 0x0F) << 2 ];
		z64[3] = '=';
		
		rc = xConsumer((const void *)z64, sizeof(z64), pUserData);
		if( rc != SXRET_OK ){return SXERR_ABORT;}

	}else if( i < nLen ){
		z64[0] = zBase64[(zIn[i] >> 2) & 0x3F];
		z64[1]   = zBase64[(zIn[i] & 0x03) << 4];
		z64[2] = '=';
		z64[3] = '=';
		
		rc = xConsumer((const void *)z64, sizeof(z64), pUserData);
		if( rc != SXRET_OK ){return SXERR_ABORT;}
	}

	return SXRET_OK;
}